

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

ScpServer * scp_recognise_exec(SshChannel *sc,SftpServerVtable *sftpserver_vt,ptrlen command)

{
  ptrlen whole;
  ptrlen whole_00;
  ptrlen whole_01;
  ptrlen whole_02;
  ptrlen pathname;
  ptrlen whole_03;
  ptrlen pathname_00;
  _Bool _Var1;
  uint uVar2;
  ScpSink *pSVar3;
  ScpSource *pSVar4;
  ScpError *pSVar5;
  ptrlen pVar6;
  ptrlen pVar7;
  ScpError *scp_2;
  ScpSource *scp_1;
  ScpSink *scp;
  ptrlen command_orig;
  _Bool targetshouldbedirectory;
  _Bool preserve;
  _Bool recursive;
  SftpServerVtable *sftpserver_vt_local;
  SshChannel *sc_local;
  ptrlen command_local;
  
  command_orig.len._7_1_ = false;
  command_orig.len._6_1_ = false;
  command_orig.len._5_1_ = false;
  sc_local = (SshChannel *)command.ptr;
  command_local.ptr = (void *)command.len;
  pVar6 = make_ptrlen("scp ",4);
  pVar7.len = (size_t)command_local.ptr;
  pVar7.ptr = sc_local;
  _Var1 = ptrlen_startswith(pVar7,pVar6,(ptrlen *)&sc_local);
  if (_Var1) {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            pVar7 = make_ptrlen("-v ",3);
            pVar6.len = (size_t)command_local.ptr;
            pVar6.ptr = sc_local;
            _Var1 = ptrlen_startswith(pVar6,pVar7,(ptrlen *)&sc_local);
          } while (_Var1);
          pVar7 = make_ptrlen("-r ",3);
          whole.len = (size_t)command_local.ptr;
          whole.ptr = sc_local;
          _Var1 = ptrlen_startswith(whole,pVar7,(ptrlen *)&sc_local);
          if (!_Var1) break;
          command_orig.len._7_1_ = true;
        }
        pVar7 = make_ptrlen("-p ",3);
        whole_00.len = (size_t)command_local.ptr;
        whole_00.ptr = sc_local;
        _Var1 = ptrlen_startswith(whole_00,pVar7,(ptrlen *)&sc_local);
        if (!_Var1) break;
        command_orig.len._6_1_ = true;
      }
      pVar7 = make_ptrlen("-d ",3);
      whole_01.len = (size_t)command_local.ptr;
      whole_01.ptr = sc_local;
      _Var1 = ptrlen_startswith(whole_01,pVar7,(ptrlen *)&sc_local);
      if (!_Var1) break;
      command_orig.len._5_1_ = true;
    }
    pVar7 = make_ptrlen("-t ",3);
    whole_02.len = (size_t)command_local.ptr;
    whole_02.ptr = sc_local;
    _Var1 = ptrlen_startswith(whole_02,pVar7,(ptrlen *)&sc_local);
    if (_Var1) {
      pathname.len = (size_t)command_local.ptr;
      pathname.ptr = sc_local;
      pSVar3 = scp_sink_new(sc,sftpserver_vt,pathname,command_orig.len._5_1_);
      command_local.len = (size_t)&pSVar3->scpserver;
    }
    else {
      pVar7 = make_ptrlen("-f ",3);
      whole_03.len = (size_t)command_local.ptr;
      whole_03.ptr = sc_local;
      _Var1 = ptrlen_startswith(whole_03,pVar7,(ptrlen *)&sc_local);
      if (_Var1) {
        pathname_00.len = (size_t)command_local.ptr;
        pathname_00.ptr = sc_local;
        pSVar4 = scp_source_new(sc,sftpserver_vt,pathname_00);
        pSVar4->recursive = command_orig.len._7_1_;
        pSVar4->send_file_times = command_orig.len._6_1_;
        command_local.len = (size_t)&pSVar4->scpserver;
      }
      else {
        uVar2 = string_length_for_printf(command.len);
        pSVar5 = scp_error_new(sc,"Unable to parse scp command: \'%.*s\'",(ulong)uVar2,
                               (SshChannel *)command.ptr);
        command_local.len = (size_t)&pSVar5->scpserver;
      }
    }
  }
  else {
    command_local.len = 0;
  }
  return (ScpServer *)command_local.len;
}

Assistant:

ScpServer *scp_recognise_exec(
    SshChannel *sc, const SftpServerVtable *sftpserver_vt, ptrlen command)
{
    bool recursive = false, preserve = false;
    bool targetshouldbedirectory = false;
    ptrlen command_orig = command;

    if (!ptrlen_startswith(command, PTRLEN_LITERAL("scp "), &command))
        return NULL;

    while (1) {
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-v "), &command)) {
            /* Enable verbose mode in the server, which we ignore */
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-r "), &command)) {
            recursive = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-p "), &command)) {
            preserve = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-d "), &command)) {
            targetshouldbedirectory = true;
            continue;
        }
        break;
    }

    if (ptrlen_startswith(command, PTRLEN_LITERAL("-t "), &command)) {
        ScpSink *scp = scp_sink_new(sc, sftpserver_vt, command,
                                    targetshouldbedirectory);
        return &scp->scpserver;
    } else if (ptrlen_startswith(command, PTRLEN_LITERAL("-f "), &command)) {
        ScpSource *scp = scp_source_new(sc, sftpserver_vt, command);
        scp->recursive = recursive;
        scp->send_file_times = preserve;
        return &scp->scpserver;
    } else {
        ScpError *scp = scp_error_new(
            sc, "Unable to parse scp command: '%.*s'",
            PTRLEN_PRINTF(command_orig));
        return &scp->scpserver;
    }
}